

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFileSuffix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  ArtifactType artifact_00;
  bool bVar1;
  char *__s;
  undefined1 local_b0 [8];
  string base;
  undefined1 local_88 [8];
  string prefix;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *suffix_1;
  string *psStack_20;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *suffix;
  
  suffix_1._4_4_ = artifact;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  bVar1 = IsImported(this);
  artifact_00 = suffix_1._4_4_;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    __s = GetFileSuffixInternal(this,artifact_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    prefix.field_2._M_local_buf[10] = '\0';
    local_30 = __s;
    if (__s == (char *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      std::allocator<char>::allocator();
      prefix.field_2._M_local_buf[10] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,
                 (allocator<char> *)(prefix.field_2._M_local_buf + 0xb));
    }
    if ((prefix.field_2._M_local_buf[10] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(prefix.field_2._M_local_buf + 0xb));
    }
  }
  else {
    std::__cxx11::string::string((string *)local_88);
    base.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)local_b0);
    GetFullNameInternal(this,psStack_20,suffix_1._4_4_,(string *)local_88,(string *)local_b0,
                        __return_storage_ptr__);
    base.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string((string *)local_b0);
    if ((base.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFileSuffix(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  if (this->IsImported()) {
    const char* suffix = this->GetFileSuffixInternal(artifact);

    return suffix ? suffix : std::string();
  }

  std::string prefix, suffix, base;
  this->GetFullNameInternal(config, artifact, prefix, base, suffix);
  return suffix;
}